

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queries.c
# Opt level: O2

vec3_t project_to_plane(plane_t p,vec3_t pt)

{
  ulong uVar1;
  ray3_t r;
  vec3_t vVar2;
  ray3_t ray;
  undefined4 uStack_24;
  undefined4 uStack_20;
  vec3_t local_18;
  
  local_18.z = pt.z;
  local_18._0_8_ = pt._0_8_;
  uVar1 = p._0_8_ ^ 0x8000000080000000;
  uStack_24 = (undefined4)uVar1;
  uStack_20 = (undefined4)(uVar1 >> 0x20);
  uVar1 = CONCAT44(p.c,uStack_20) ^ 0x8000000000000000;
  r.direction.x = (float)uStack_24;
  r.start.z = local_18.z;
  r.start.x = local_18.x;
  r.start.y = local_18.y;
  r.direction.y = (float)(int)uVar1;
  r.direction.z = (float)(int)(uVar1 >> 0x20);
  plane_ray3_intersection(p,r,&local_18);
  vVar2.z = local_18.z;
  vVar2.x = local_18.x;
  vVar2.y = local_18.y;
  return vVar2;
}

Assistant:

vec3_t
project_to_plane(plane_t p, vec3_t pt) {
    vec3_t  invN    = vec3_mulf(plane_normal(p), -1.0f);
    ray3_t  ray     = ray3_from(pt, invN);
    vec3_t  out     = pt;
    plane_ray3_intersection(p, ray, &out);
    return out;
}